

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

xmlChar * xmlUTF8Strndup(xmlChar *utf,int len)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlChar *__dest;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  
  if (len < 0 || utf == (xmlChar *)0x0) {
    __dest = (xmlChar *)0x0;
  }
  else {
    iVar2 = xmlUTF8Strsize(utf,len);
    __dest = (xmlChar *)(*xmlMallocAtomic)((long)(iVar2 + 1));
    if (__dest == (xmlChar *)0x0) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      __dest = (xmlChar *)0x0;
      (*p_Var1)(*ppvVar4,"malloc of %ld byte failed\n",(ulong)(len + 1));
    }
    else {
      memcpy(__dest,utf,(long)iVar2);
      __dest[iVar2] = '\0';
    }
  }
  return __dest;
}

Assistant:

xmlChar *
xmlUTF8Strndup(const xmlChar *utf, int len) {
    xmlChar *ret;
    int i;

    if ((utf == NULL) || (len < 0)) return(NULL);
    i = xmlUTF8Strsize(utf, len);
    ret = (xmlChar *) xmlMallocAtomic((i + 1) * sizeof(xmlChar));
    if (ret == NULL) {
        xmlGenericError(xmlGenericErrorContext,
                "malloc of %ld byte failed\n",
                (len + 1) * (long)sizeof(xmlChar));
        return(NULL);
    }
    memcpy(ret, utf, i * sizeof(xmlChar));
    ret[i] = 0;
    return(ret);
}